

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

StringPtr kj::operator*(uint param_1)

{
  Type type_local;
  
  StringPtr::StringPtr((StringPtr *)&type_local,operator*::TYPE_STRINGS[param_1]);
  return (StringPtr)_type_local;
}

Assistant:

StringPtr KJ_STRINGIFY(Exception::Type type) {
  static const char* TYPE_STRINGS[] = {
    "failed",
    "overloaded",
    "disconnected",
    "unimplemented"
  };

  return TYPE_STRINGS[static_cast<uint>(type)];
}